

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_as_double(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  double dVar5;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  bson_init(local_180);
  cVar1 = bson_append_double(0x4093487e5c91d14e,local_180,"key",0xffffffffffffffff);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_double (&b, \"key\", -1, 1234.1234)";
    uVar3 = 0x170;
  }
  else {
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    if (cVar1 == '\0') {
      pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
      uVar3 = 0x171;
    }
    else {
      iVar2 = bson_iter_type(auStack_200);
      if (iVar2 == 1) {
        dVar5 = (double)bson_iter_as_double(auStack_200);
        if ((dVar5 != 1234.1234) || (NAN(dVar5))) {
          pcVar4 = "bson_iter_as_double (&iter) == 1234.1234";
          uVar3 = 0x173;
        }
        else {
          bson_destroy(local_180);
          bson_init(local_180);
          cVar1 = bson_append_int32(local_180,"key",0xffffffffffffffff,0x4d2);
          if (cVar1 == '\0') {
            pcVar4 = "bson_append_int32 (&b, \"key\", -1, 1234)";
            uVar3 = 0x177;
          }
          else {
            cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
            if (cVar1 == '\0') {
              pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
              uVar3 = 0x178;
            }
            else {
              iVar2 = bson_iter_type(auStack_200);
              if (iVar2 == 0x10) {
                dVar5 = (double)bson_iter_as_double(auStack_200);
                if ((dVar5 != 1234.0) || (NAN(dVar5))) {
                  pcVar4 = "bson_iter_as_double (&iter) == 1234.0";
                  uVar3 = 0x17a;
                }
                else {
                  bson_destroy(local_180);
                  bson_init(local_180);
                  cVar1 = bson_append_int64(local_180,"key",0xffffffffffffffff,0x10e1);
                  if (cVar1 == '\0') {
                    pcVar4 = "bson_append_int64 (&b, \"key\", -1, 4321)";
                    uVar3 = 0x17e;
                  }
                  else {
                    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
                    if (cVar1 == '\0') {
                      pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
                      uVar3 = 0x17f;
                    }
                    else {
                      iVar2 = bson_iter_type(auStack_200);
                      if (iVar2 == 0x12) {
                        dVar5 = (double)bson_iter_as_double(auStack_200);
                        if ((dVar5 == 4321.0) && (!NAN(dVar5))) {
                          bson_destroy(local_180);
                          return;
                        }
                        pcVar4 = "bson_iter_as_double (&iter) == 4321.0";
                        uVar3 = 0x181;
                      }
                      else {
                        pcVar4 = "BSON_ITER_HOLDS_INT64 (&iter)";
                        uVar3 = 0x180;
                      }
                    }
                  }
                }
              }
              else {
                pcVar4 = "BSON_ITER_HOLDS_INT32 (&iter)";
                uVar3 = 0x179;
              }
            }
          }
        }
      }
      else {
        pcVar4 = "BSON_ITER_HOLDS_DOUBLE (&iter)";
        uVar3 = 0x172;
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar3,"test_bson_iter_as_double",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_as_double (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   ASSERT (bson_append_double (&b, "key", -1, 1234.1234));
   ASSERT (bson_iter_init_find (&iter, &b, "key"));
   ASSERT (BSON_ITER_HOLDS_DOUBLE (&iter));
   ASSERT (bson_iter_as_double (&iter) == 1234.1234);
   bson_destroy (&b);

   bson_init (&b);
   ASSERT (bson_append_int32 (&b, "key", -1, 1234));
   ASSERT (bson_iter_init_find (&iter, &b, "key"));
   ASSERT (BSON_ITER_HOLDS_INT32 (&iter));
   ASSERT (bson_iter_as_double (&iter) == 1234.0);
   bson_destroy (&b);

   bson_init (&b);
   ASSERT (bson_append_int64 (&b, "key", -1, 4321));
   ASSERT (bson_iter_init_find (&iter, &b, "key"));
   ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   ASSERT (bson_iter_as_double (&iter) == 4321.0);
   bson_destroy (&b);
}